

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_stream.c
# Opt level: O0

int mk_channel_flush(mk_channel *channel)

{
  mk_event_loop *loop;
  bool local_35;
  ulong uStack_30;
  uint32_t stop;
  size_t total;
  size_t count;
  mk_channel *pmStack_18;
  int ret;
  mk_channel *channel_local;
  
  count._4_4_ = 0;
  total = 0;
  uStack_30 = 0;
  pmStack_18 = channel;
  do {
    count._4_4_ = mk_channel_write(pmStack_18,&total);
    uStack_30 = total + uStack_30;
    local_35 = uStack_30 < 0x1001 && (count._4_4_ & 0xb) == 0;
  } while (local_35);
  channel_local._4_4_ = count._4_4_;
  if (count._4_4_ != 1) {
    if (((count._4_4_ & 0x14) != 0) && ((pmStack_18->event->mask & 4) == 0)) {
      loop = mk_sched_loop();
      mk_event_add(loop,pmStack_18->fd,3,4,pmStack_18->event);
    }
    channel_local._4_4_ = count._4_4_;
  }
  return channel_local._4_4_;
}

Assistant:

int mk_channel_flush(struct mk_channel *channel)
{
    int ret = 0;
    size_t count = 0;
    size_t total = 0;
    uint32_t stop = (MK_CHANNEL_DONE | MK_CHANNEL_ERROR | MK_CHANNEL_EMPTY);

    do {
        ret = mk_channel_write(channel, &count);
        total += count;

#ifdef MK_HAVE_TRACE
        MK_TRACE("Channel flush: %d bytes", count);
        if (ret & MK_CHANNEL_DONE) {
            MK_TRACE("Channel was empty");
        }
        if (ret & MK_CHANNEL_ERROR) {
            MK_TRACE("Channel error");
        }
        if (ret & MK_CHANNEL_EMPTY) {
            MK_TRACE("Channel empty");
        }
#endif
    } while (total <= 4096 && ((ret & stop) == 0));

    if (ret == MK_CHANNEL_DONE) {
        MK_TRACE("Channel done");
        return ret;
    }
    else if (ret & (MK_CHANNEL_FLUSH | MK_CHANNEL_BUSY)) {
        MK_TRACE("Channel FLUSH | BUSY");
        if ((channel->event->mask & MK_EVENT_WRITE) == 0) {
            mk_event_add(mk_sched_loop(),
                         channel->fd,
                         MK_EVENT_CONNECTION,
                         MK_EVENT_WRITE,
                         channel->event);
        }
    }

    return ret;
}